

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::DemoRecorder_Start(CClient *this,char *pFilename,bool WithTimestamp)

{
  long lVar1;
  int iVar2;
  IGameClient *pIVar3;
  undefined4 extraout_var;
  byte in_DL;
  undefined8 in_RSI;
  CClient *in_RDI;
  long in_FS_OFFSET;
  char aDate [20];
  char aFilename [128];
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  undefined1 local_a8 [32];
  char local_88 [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = IClient::State(&in_RDI->super_IClient);
  if (iVar2 == 3) {
    if ((in_DL & 1) == 0) {
      str_format(local_88,0x80,"demos/%s.demo",in_RSI);
    }
    else {
      str_timestamp(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      str_format(local_88,0x80,"demos/%s_%s.demo",in_RSI,local_a8);
    }
    pIVar3 = GameClient(in_RDI);
    iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])();
    CDemoRecorder::Start
              (&in_RDI->m_DemoRecorder,local_88,(char *)CONCAT44(extraout_var,iVar2),
               in_RDI->m_aCurrentMap,(SHA256_DIGEST)*&(in_RDI->m_CurrentMapSha256).data,
               in_RDI->m_CurrentMapCrc,"client");
  }
  else {
    (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (in_RDI->m_pConsole,0,"demorec/record","client is not online");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CClient::DemoRecorder_Start(const char *pFilename, bool WithTimestamp)
{
	if(State() != IClient::STATE_ONLINE)
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "demorec/record", "client is not online");
	else
	{
		char aFilename[128];
		if(WithTimestamp)
		{
			char aDate[20];
			str_timestamp(aDate, sizeof(aDate));
			str_format(aFilename, sizeof(aFilename), "demos/%s_%s.demo", pFilename, aDate);
		}
		else
			str_format(aFilename, sizeof(aFilename), "demos/%s.demo", pFilename);
		m_DemoRecorder.Start(aFilename, GameClient()->NetVersion(), m_aCurrentMap, m_CurrentMapSha256, m_CurrentMapCrc, "client");
	}
}